

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void imguiMaterial(cgltf_material *material)

{
  cgltf_material *pcVar1;
  cgltf_texture *pcVar2;
  bool bVar3;
  ulong uVar4;
  u8 *puVar5;
  char (*in_R8) [2];
  int *in_R9;
  long lVar6;
  CStr str;
  CStr str_00;
  CStrT<char> local_58;
  FmtBuffer local_48;
  
  pcVar1 = parsedData->materials;
  ImGui::Text("Name: %s",material->name);
  if (material->has_pbr_metallic_roughness != 0) {
    bVar3 = ImGui::TreeNode("PBR Metallic-Roughness");
    if (bVar3) {
      lVar6 = (long)material - (long)pcVar1 >> 3;
      ImGui::Text("Base color factor: {%g, %g, %g, %g}",
                  (double)(material->pbr_metallic_roughness).base_color_factor[0],
                  (double)(material->pbr_metallic_roughness).base_color_factor[1],
                  (double)(material->pbr_metallic_roughness).base_color_factor[2],
                  (double)(material->pbr_metallic_roughness).base_color_factor[3]);
      ImGui::Text("Metallic factor: %g",(double)(material->pbr_metallic_roughness).metallic_factor);
      ImGui::Text("Roughness factor: %g",(double)(material->pbr_metallic_roughness).roughness_factor
                 );
      pcVar2 = (material->pbr_metallic_roughness).base_color_texture.texture;
      if (pcVar2 != (cgltf_texture *)0x0) {
        uVar4 = (ulong)((long)pcVar2 - (long)parsedData->textures) >> 3;
        local_48.start = (char *)scratch._data;
        local_48.end = (char *)scratch._data;
        local_48.size = (int)scratch._size;
        puVar5 = scratch._data;
        tl::CStrT<char>::CStrT(&local_58,"Color texture: ");
        str._str = (char *)puVar5;
        str._0_8_ = local_58._str;
        tl::toStringBufferT((tl *)&local_48,(FmtBuffer *)(ulong)local_58._size,str);
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_48,(unsigned_long *)(lVar6 * 0x7e3f1f8fc7e3f1f9),
                   (char (*) [4])(&gpu::textureSizes + uVar4 * 0xccccccccccccccd),
                   (int *)((long)&gpu::textureSizes + uVar4 * 0x6666666666666668 + 4),in_R8,in_R9);
        local_48.end[-(ulong)(local_48.size == 0)] = '\0';
        bVar3 = ImGui::TreeNode((char *)scratch._data);
        if (bVar3) {
          imguiTextureView(&(material->pbr_metallic_roughness).base_color_texture,
                           (float *)(&imgui_state::materialTexturesHeights +
                                    lVar6 * -0x1c0e070381c0e07));
          ImGui::TreePop();
        }
      }
      pcVar2 = (material->pbr_metallic_roughness).metallic_roughness_texture.texture;
      if (pcVar2 != (cgltf_texture *)0x0) {
        uVar4 = (ulong)((long)pcVar2 - (long)parsedData->textures) >> 3;
        local_48.start = (char *)scratch._data;
        local_48.end = (char *)scratch._data;
        local_48.size = (int)scratch._size;
        puVar5 = scratch._data;
        tl::CStrT<char>::CStrT(&local_58,"Metallic-roughness texture: ");
        str_00._str = (char *)puVar5;
        str_00._0_8_ = local_58._str;
        tl::toStringBufferT((tl *)&local_48,(FmtBuffer *)(ulong)local_58._size,str_00);
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_48,(unsigned_long *)(lVar6 * 0x7e3f1f8fc7e3f1f9),
                   (char (*) [4])(&gpu::textureSizes + uVar4 * 0xccccccccccccccd),
                   (int *)((long)&gpu::textureSizes + uVar4 * 0x6666666666666668 + 4),in_R8,in_R9);
        local_48.end[-(ulong)(local_48.size == 0)] = '\0';
        bVar3 = ImGui::TreeNode((char *)scratch._data);
        if (bVar3) {
          imguiTextureView(&(material->pbr_metallic_roughness).metallic_roughness_texture,
                           (float *)((long)&imgui_state::materialTexturesHeights +
                                    lVar6 * -0xe070381c0e07038 + 4));
          ImGui::TreePop();
        }
      }
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void imguiMaterial(const cgltf_material& material)
{
    const size_t i = getMaterialInd(&material);
    ImGui::Text("Name: %s", material.name);
    if(material.has_pbr_metallic_roughness)
    if(ImGui::TreeNode("PBR Metallic-Roughness"))
    {
        const auto& props = material.pbr_metallic_roughness;
        const auto& colorFactor = props.base_color_factor;
        ImGui::Text("Base color factor: {%g, %g, %g, %g}", colorFactor[0], colorFactor[1], colorFactor[2], colorFactor[3]);
        ImGui::Text("Metallic factor: %g", props.metallic_factor);
        ImGui::Text("Roughness factor: %g", props.roughness_factor);
        if(props.base_color_texture.texture)
        {
            const size_t texInd = getTextureInd(props.base_color_texture.texture);
            tl::toStringBuffer(scratchStr(), "Color texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.base_color_texture, &imgui_state::materialTexturesHeights[i].color);
                ImGui::TreePop();
            }
        }
        if(props.metallic_roughness_texture.texture)
        {
            const size_t texInd = getTextureInd(props.metallic_roughness_texture.texture);
            tl::toStringBuffer(scratchStr(), "Metallic-roughness texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.metallic_roughness_texture, &imgui_state::materialTexturesHeights[i].metallicRoughness);
                ImGui::TreePop();
            }
        }
        ImGui::TreePop();
    }
}